

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t
ctrl_set_bitrate_one_pass_cbr(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  AV1_PRIMARY *ppi_00;
  AV1_COMP *pAVar2;
  int iVar3;
  int *framerate;
  AV1_COMP *in_RSI;
  long in_RDI;
  int new_bitrate;
  AV1EncoderConfig *oxcf;
  AV1_COMP *cpi;
  AV1_PRIMARY *ppi;
  AV1_COMP *in_stack_ffffffffffffffc0;
  aom_codec_err_t local_4;
  
  ppi_00 = *(AV1_PRIMARY **)(in_RDI + 0xb50);
  pAVar2 = ppi_00->cpi;
  iVar3 = is_one_pass_rt_params(in_stack_ffffffffffffffc0);
  if ((((iVar3 == 0) || ((pAVar2->oxcf).rc_cfg.mode != AOM_CBR)) || (pAVar2->ppi->use_svc != 0)) ||
     ((ppi_00->num_fp_contexts != 1 || (ppi_00->cpi_lap != (AV1_COMP *)0x0)))) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    uVar1 = *(uint *)&in_RSI->ppi;
    if (uVar1 < 0x29) {
      framerate = (int *)((long)(int)uVar1 +
                         *(long *)(in_RSI->enc_quant_dequant_params).quants.y_quant[0]);
      *(uint *)&in_RSI->ppi = uVar1 + 8;
    }
    else {
      framerate = *(int **)&in_RSI->field_0x8;
      *(int **)&in_RSI->field_0x8 = framerate + 2;
    }
    iVar3 = *framerate;
    *(int *)(in_RDI + 0x158) = iVar3;
    (pAVar2->oxcf).rc_cfg.target_bandwidth = (long)(iVar3 * 1000);
    set_primary_rc_buffer_sizes(&pAVar2->oxcf,ppi_00);
    av1_new_framerate(in_RSI,(double)framerate);
    check_reset_rc_flag(in_RSI);
    local_4 = AOM_CODEC_OK;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_set_bitrate_one_pass_cbr(aom_codec_alg_priv_t *ctx,
                                                     va_list args) {
  AV1_PRIMARY *const ppi = ctx->ppi;
  AV1_COMP *const cpi = ppi->cpi;
  AV1EncoderConfig *oxcf = &cpi->oxcf;
  if (!is_one_pass_rt_params(cpi) || oxcf->rc_cfg.mode != AOM_CBR ||
      cpi->ppi->use_svc || ppi->num_fp_contexts != 1 || ppi->cpi_lap != NULL) {
    return AOM_CODEC_INVALID_PARAM;
  }
  const int new_bitrate = CAST(AV1E_SET_BITRATE_ONE_PASS_CBR, args);
  ctx->cfg.rc_target_bitrate = new_bitrate;
  oxcf->rc_cfg.target_bandwidth = new_bitrate * 1000;
  set_primary_rc_buffer_sizes(oxcf, ppi);
  av1_new_framerate(cpi, cpi->framerate);
  check_reset_rc_flag(cpi);
  return AOM_CODEC_OK;
}